

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ImVector<ImFontGlyph> *this_00;
  ImVector<unsigned_short> *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImWchar IVar7;
  ImFontGlyph *pIVar8;
  float *pfVar9;
  unsigned_short *puVar10;
  ImFontGlyph *pIVar11;
  uint uVar12;
  int i_1;
  int iVar13;
  int i_2;
  int i;
  uint uVar14;
  float fVar15;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  
  this_00 = &this->Glyphs;
  uVar12 = 0;
  for (uVar14 = 0; uVar14 != this_00->Size; uVar14 = uVar14 + 1) {
    pIVar8 = ImVector<ImFontGlyph>::operator[](this_00,uVar14);
    if (uVar12 <= *(uint *)pIVar8 >> 2) {
      uVar12 = *(uint *)pIVar8 >> 2;
    }
  }
  if (uVar14 < 0xffff) {
    ImVector<float>::clear(&this->IndexAdvanceX);
    this_01 = &this->IndexLookup;
    ImVector<unsigned_short>::clear(this_01);
    this->DirtyLookupTables = false;
    this->Used4kPagesMap[0] = '\0';
    this->Used4kPagesMap[1] = '\0';
    GrowIndex(this,uVar12 + 1);
    for (iVar13 = 0; iVar13 < this_00->Size; iVar13 = iVar13 + 1) {
      pIVar8 = ImVector<ImFontGlyph>::operator[](this_00,iVar13);
      uVar14 = *(uint *)pIVar8;
      pIVar8 = ImVector<ImFontGlyph>::operator[](this_00,iVar13);
      fVar15 = pIVar8->AdvanceX;
      pfVar9 = ImVector<float>::operator[](&this->IndexAdvanceX,uVar14 >> 2);
      *pfVar9 = fVar15;
      puVar10 = ImVector<unsigned_short>::operator[](this_01,uVar14 >> 2);
      *puVar10 = (unsigned_short)iVar13;
      this->Used4kPagesMap[uVar14 >> 0x11] =
           this->Used4kPagesMap[uVar14 >> 0x11] | (byte)(1 << ((byte)(uVar14 >> 0xe) & 7));
    }
    pIVar8 = FindGlyph(this,0x20);
    if (pIVar8 != (ImFontGlyph *)0x0) {
      pIVar8 = ImVector<ImFontGlyph>::back(this_00);
      if (((undefined1  [40])*pIVar8 & (undefined1  [40])0xfffffffc) != (undefined1  [40])0x24) {
        ImVector<ImFontGlyph>::resize(this_00,this_00->Size + 1);
      }
      pIVar8 = ImVector<ImFontGlyph>::back(this_00);
      pIVar11 = FindGlyph(this,0x20);
      fVar15 = pIVar11->AdvanceX;
      fVar1 = pIVar11->X0;
      fVar2 = pIVar11->Y0;
      fVar3 = pIVar11->X1;
      fVar4 = pIVar11->Y1;
      fVar5 = pIVar11->U0;
      fVar6 = pIVar11->V0;
      *(undefined4 *)&pIVar8->field_0x0 = *(undefined4 *)&pIVar11->field_0x0;
      pIVar8->AdvanceX = fVar15;
      pIVar8->X0 = fVar1;
      pIVar8->Y0 = fVar2;
      pIVar8->X1 = fVar3;
      pIVar8->Y1 = fVar4;
      pIVar8->U0 = fVar5;
      pIVar8->V0 = fVar6;
      fVar15 = pIVar11->V1;
      pIVar8->U1 = pIVar11->U1;
      pIVar8->V1 = fVar15;
      *(uint *)pIVar8 = *(uint *)pIVar8 & 3 | 0x24;
      fVar15 = pIVar8->AdvanceX * 4.0;
      pIVar8->AdvanceX = fVar15;
      pfVar9 = ImVector<float>::operator[](&this->IndexAdvanceX,9);
      *pfVar9 = fVar15;
      iVar13 = (this->Glyphs).Size;
      puVar10 = ImVector<unsigned_short>::operator[](this_01,*(uint *)pIVar8 >> 2);
      *puVar10 = (short)iVar13 - 1;
    }
    SetGlyphVisible(this,0x20,false);
    SetGlyphVisible(this,9,false);
    ellipsis_chars[0] = 0x2026;
    ellipsis_chars[1] = 0x85;
    dots_chars[0] = 0x2e;
    dots_chars[1] = 0xff0e;
    if (this->EllipsisChar == 0xffff) {
      IVar7 = FindFirstExistingGlyph(this,ellipsis_chars,2);
      this->EllipsisChar = IVar7;
    }
    if (this->DotChar == 0xffff) {
      IVar7 = FindFirstExistingGlyph(this,dots_chars,2);
      this->DotChar = IVar7;
    }
    pIVar8 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar8;
    if (pIVar8 == (ImFontGlyph *)0x0) {
      IVar7 = FindFirstExistingGlyph(this,(ImWchar *)&DAT_001d1312,3);
      this->FallbackChar = IVar7;
      pIVar8 = FindGlyphNoFallback(this,IVar7);
      this->FallbackGlyph = pIVar8;
      if (pIVar8 == (ImFontGlyph *)0x0) {
        pIVar8 = ImVector<ImFontGlyph>::back(this_00);
        this->FallbackGlyph = pIVar8;
        this->FallbackChar = (ImWchar)(*(uint *)pIVar8 >> 2);
      }
    }
    this->FallbackAdvanceX = pIVar8->AdvanceX;
    for (iVar13 = 0; uVar12 + 1 != iVar13; iVar13 = iVar13 + 1) {
      pfVar9 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar13);
      if (*pfVar9 <= 0.0 && *pfVar9 != 0.0) {
        fVar15 = this->FallbackAdvanceX;
        pfVar9 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar13);
        *pfVar9 = fVar15;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_draw.cpp"
                ,0xc5d,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}